

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O3

bool __thiscall Rml::DataParser::Match(DataParser *this,char c,bool skip_whitespace)

{
  ulong uVar1;
  pointer pcVar2;
  byte bVar3;
  char cVar4;
  ulong uVar5;
  ulong uVar6;
  
  bVar3 = this->reached_end;
  if ((bool)bVar3 == false) {
    cVar4 = (this->expression)._M_dataplus._M_p[this->index];
  }
  else {
    cVar4 = '\0';
  }
  if (cVar4 == c) {
    uVar1 = (this->expression)._M_string_length;
    uVar5 = this->index + 1;
    this->index = uVar5;
    if (uVar1 <= uVar5) {
      this->reached_end = true;
      bVar3 = 1;
    }
    if (skip_whitespace) {
      pcVar2 = (this->expression)._M_dataplus._M_p;
      if (bVar3 == 0) {
        uVar6 = (ulong)(byte)pcVar2[uVar5];
      }
      else {
        uVar6 = 0;
      }
LAB_001f42f3:
      do {
        uVar5 = uVar5 + 1;
        if ((0x20 < (byte)uVar6) || ((0x100002600U >> (uVar6 & 0x3f) & 1) == 0)) break;
        this->index = uVar5;
        if (uVar5 < uVar1) {
          if ((bVar3 & 1) == 0) {
            uVar6 = (ulong)(byte)pcVar2[uVar5];
            goto LAB_001f42f3;
          }
        }
        else {
          this->reached_end = true;
          bVar3 = 1;
        }
        uVar6 = 0;
      } while( true );
    }
  }
  else {
    Expected(this,c);
  }
  return cVar4 == c;
}

Assistant:

bool Match(char c, bool skip_whitespace = true)
	{
		if (c == Look())
		{
			Next();
			if (skip_whitespace)
				SkipWhitespace();
			return true;
		}
		Expected(c);
		return false;
	}